

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffchdu(fitsfile *fptr,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  ulong uVar3;
  uint uVar4;
  int stdriver;
  char message [81];
  int local_7c;
  char local_78 [88];
  
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if (fptr->Fptr->writemode == 1) {
      urltype2driver("stream://",&local_7c);
      pFVar2 = fptr->Fptr;
      if (pFVar2->driver != local_7c) {
        ffrdef(fptr,status);
        pFVar2 = fptr->Fptr;
      }
      if (0 < pFVar2->heapsize) {
        ffuptf(fptr,status);
      }
      ffpdfl(fptr,status);
    }
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar2 = fptr->Fptr;
  if ((pFVar2->open_count == 1) && (pFVar2->tableptr != (tcolumn *)0x0)) {
    free(pFVar2->tableptr);
    pFVar2 = fptr->Fptr;
    pFVar2->tableptr = (tcolumn *)0x0;
    if (pFVar2->tilerow != (int *)0x0) {
      uVar4 = (uint)((pFVar2->znaxis[0] + -1) / pFVar2->tilesize[0]);
      if (uVar4 < 0x7fffffff) {
        uVar3 = 0;
        do {
          pFVar2 = fptr->Fptr;
          if (pFVar2->tiledata[uVar3] != (void *)0x0) {
            free(pFVar2->tiledata[uVar3]);
            pFVar2 = fptr->Fptr;
          }
          if (pFVar2->tilenullarray[uVar3] != (void *)0x0) {
            free(pFVar2->tilenullarray[uVar3]);
          }
          uVar3 = uVar3 + 1;
        } while (uVar4 + 1 != uVar3);
        pFVar2 = fptr->Fptr;
      }
      free(pFVar2->tileanynull);
      free(fptr->Fptr->tiletype);
      free(fptr->Fptr->tiledatasize);
      free(fptr->Fptr->tilenullarray);
      free(fptr->Fptr->tiledata);
      free(fptr->Fptr->tilerow);
      pFVar2 = fptr->Fptr;
      pFVar2->tilenullarray = (void **)0x0;
      pFVar2->tileanynull = (int *)0x0;
      pFVar2->tiletype = (int *)0x0;
      pFVar2->tiledata = (void **)0x0;
      pFVar2->tilerow = (int *)0x0;
      pFVar2->tiledatasize = (long *)0x0;
    }
  }
  iVar1 = *status;
  if (iVar1 != 999 && 0 < iVar1) {
    snprintf(local_78,0x51,"Error while closing HDU number %d (ffchdu).",(ulong)(uint)pFVar2->curhdu
            );
    ffxmsg(5,local_78);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffchdu(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
{
/*
  close the current HDU.  If we have write access to the file, then:
    - write the END keyword and pad header with blanks if necessary
    - check the data fill values, and rewrite them if not correct
*/
    char message[FLEN_ERRMSG];
    int ii, stdriver, ntilebins;

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
        /* no need to do any further updating of the HDU */
    }
    else if ((fptr->Fptr)->writemode == 1)
    {
        urltype2driver("stream://", &stdriver);

        /* don't rescan header in special case of writing to stdout */
        if (((fptr->Fptr)->driver != stdriver)) 
             ffrdef(fptr, status); 

        if ((fptr->Fptr)->heapsize > 0) {
          ffuptf(fptr, status);  /* update the variable length TFORM values */
        }
	
        ffpdfl(fptr, status);  /* insure correct data fill values */
    }

    if ((fptr->Fptr)->open_count == 1)
    {

    /* free memory for the CHDU structure only if no other files are using it */
        if ((fptr->Fptr)->tableptr)
        {
            free((fptr->Fptr)->tableptr);
           (fptr->Fptr)->tableptr = NULL;

          /* free the tile-compressed image cache, if it exists */
          if ((fptr->Fptr)->tilerow) {

           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
          }
        }
    }

    if (*status > 0 && *status != NO_CLOSE_ERROR)
    {
        snprintf(message,FLEN_ERRMSG,
        "Error while closing HDU number %d (ffchdu).", (fptr->Fptr)->curhdu);
        ffpmsg(message);
    }
    return(*status);
}